

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unary_executor.hpp
# Opt level: O3

long duckdb::UnaryLambdaWrapper::
     Operation<duckdb::ArrayLengthBinaryFunction(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::__0,long,long>
               (long input,ValidityMask *mask,idx_t idx,void *dataptr)

{
  reference pvVar1;
  OutOfRangeException *this;
  long in_R8;
  Exception local_68;
  undefined1 local_58 [16];
  string local_48;
  
  if ((0 < input) &&
     (input <= (long)*(mask->super_TemplatedValidityMask<unsigned_long>).validity_mask)) {
    pvVar1 = vector<long,_true>::operator[]
                       ((vector<long,_true> *)
                        (mask->super_TemplatedValidityMask<unsigned_long>).validity_data.internal.
                        super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                        ._M_ptr,input - 1);
    return *pvVar1;
  }
  this = (OutOfRangeException *)__cxa_allocate_exception(0x10);
  local_68._0_8_ = local_58;
  ::std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_68,
             "array_length dimension \'%lld\' out of range (min: \'1\', max: \'%lld\')","");
  Exception::ConstructMessage<long,long>
            (&local_48,&local_68,(string *)input,
             *(mask->super_TemplatedValidityMask<unsigned_long>).validity_mask,in_R8);
  OutOfRangeException::OutOfRangeException(this,(string *)&local_48);
  __cxa_throw(this,&OutOfRangeException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

static inline RESULT_TYPE Operation(INPUT_TYPE input, ValidityMask &mask, idx_t idx, void *dataptr) {
		auto fun = (FUNC *)dataptr;
		return (*fun)(input);
	}